

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

bool Catch::operator==(ReporterSpec *lhs,ReporterSpec *rhs)

{
  __type _Var1;
  bool bVar2;
  
  _Var1 = std::operator==(&lhs->m_name,&rhs->m_name);
  if (_Var1) {
    bVar2 = operator==(&lhs->m_outputFileName,&rhs->m_outputFileName);
    if (bVar2) {
      bVar2 = operator==(&lhs->m_colourMode,&rhs->m_colourMode);
      if (bVar2) {
        bVar2 = std::operator==(&(lhs->m_customOptions)._M_t,&(rhs->m_customOptions)._M_t);
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool operator==( ReporterSpec const& lhs, ReporterSpec const& rhs ) {
        return lhs.m_name == rhs.m_name &&
               lhs.m_outputFileName == rhs.m_outputFileName &&
               lhs.m_colourMode == rhs.m_colourMode &&
               lhs.m_customOptions == rhs.m_customOptions;
    }